

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

int Ssw_ManSweepConstr(Ssw_Man_t *p)

{
  Ssw_Sat_t *p_00;
  FILE *pFile;
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  abctime aVar8;
  Aig_Obj_t *pAVar9;
  bool local_95;
  abctime clk;
  int iLits;
  int f;
  int i;
  int nConstrPairs;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj;
  Bar_Progress_t *pProgress;
  Ssw_Man_t *p_local;
  
  pObj = (Aig_Obj_t *)0x0;
  aVar4 = Abc_Clock();
  pAVar5 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar5;
  iVar1 = Aig_ManCoNum(p->pFrames);
  iVar2 = Aig_ManRegNum(p->pAig);
  uVar3 = iVar1 - iVar2;
  if ((uVar3 & 1) != 0) {
    __assert_fail("(nConstrPairs & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x279,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
  }
  for (iLits = 0; iLits < (int)uVar3; iLits = iLits + 2) {
    pAVar6 = Aig_ManCo(p->pFrames,iLits);
    pAVar7 = Aig_ManCo(p->pFrames,iLits + 1);
    pAVar6 = Aig_ObjChild0(pAVar6);
    pAVar7 = Aig_ObjChild0(pAVar7);
    Ssw_NodesAreConstrained(p,pAVar6,pAVar7);
  }
  for (iLits = 0; iVar1 = Aig_ManRegNum(p->pAig), iLits < iVar1; iLits = iLits + 1) {
    pAVar6 = Aig_ManCo(p->pFrames,uVar3 + iLits);
    p_00 = p->pMSat;
    pAVar6 = Aig_ObjFanin0(pAVar6);
    Ssw_CnfNodeAddToSolver(p_00,pAVar6);
  }
  iVar1 = p->pPars->nFramesK;
  iVar2 = Saig_ManPiNum(p->pAig);
  clk._0_4_ = iVar1 * iVar2;
  pAVar6 = Aig_ManConst1(p->pAig);
  pAVar7 = Aig_ManConst1(p->pFrames);
  Ssw_ObjSetFrame(p,pAVar6,iVar1,pAVar7);
  for (iLits = 0; iVar2 = Saig_ManPiNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iLits);
    pAVar7 = Aig_ObjCreateCi(p->pFrames);
    local_95 = false;
    if (p->vInits != (Vec_Int_t *)0x0) {
      iVar2 = Vec_IntEntry(p->vInits,(int)clk);
      local_95 = iVar2 != 0;
      clk._0_4_ = (int)clk + 1;
    }
    *(ulong *)&pAVar7->field_0x18 =
         *(ulong *)&pAVar7->field_0x18 & 0xfffffffffffffff7 | (ulong)local_95 << 3;
    Ssw_ObjSetFrame(p,pAVar6,iVar1,pAVar7);
  }
  iVar1 = Vec_IntSize(p->vInits);
  if (iVar1 == (int)clk) {
    aVar8 = Abc_Clock();
    p->timeReduce = (aVar8 - aVar4) + p->timeReduce;
    clk._4_4_ = 0;
    do {
      if (p->pPars->nFramesK < clk._4_4_) {
        iVar1 = p->pPars->nFramesK;
        sat_solver_simplify(p->pMSat->pSat);
        p->fRefined = 0;
        Ssw_ClassesClearRefined(p->ppClasses);
        pFile = _stdout;
        if (p->pPars->fVerbose != 0) {
          iVar2 = Aig_ManObjNumMax(p->pAig);
          pObj = (Aig_Obj_t *)Bar_ProgressStart(pFile,iVar2);
        }
        for (iLits = 0; iVar2 = Vec_PtrSize(p->pAig->vObjs), iLits < iVar2; iLits = iLits + 1) {
          pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,iLits);
          if (pAVar6 != (Aig_Obj_t *)0x0) {
            if (p->pPars->fVerbose != 0) {
              Bar_ProgressUpdate((Bar_Progress_t *)pObj,iLits,(char *)0x0);
            }
            iVar2 = Saig_ObjIsLo(p->pAig,pAVar6);
            if (iVar2 == 0) {
              iVar2 = Aig_ObjIsNode(pAVar6);
              if (iVar2 != 0) {
                pAVar5 = p->pFrames;
                pAVar7 = Ssw_ObjChild0Fra(p,pAVar6,iVar1);
                pAVar9 = Ssw_ObjChild1Fra(p,pAVar6,iVar1);
                pAVar7 = Aig_And(pAVar5,pAVar7,pAVar9);
                Ssw_ObjSetFrame(p,pAVar6,iVar1,pAVar7);
                uVar3 = Ssw_ManSweepNodeConstr(p,pAVar6,iVar1,0);
                p->fRefined = uVar3 | p->fRefined;
              }
            }
            else {
              uVar3 = Ssw_ManSweepNodeConstr(p,pAVar6,iVar1,0);
              p->fRefined = uVar3 | p->fRefined;
            }
          }
        }
        if (p->pPars->fVerbose != 0) {
          Bar_ProgressStop((Bar_Progress_t *)pObj);
        }
        return p->fRefined;
      }
      for (iLits = 0; iVar1 = Saig_ManPoNum(p->pAig), iLits < iVar1; iLits = iLits + 1) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iLits);
        iVar1 = Saig_ManPoNum(p->pAig);
        iVar2 = Saig_ManConstrNum(p->pAig);
        if (iVar1 - iVar2 <= iLits) {
          pAVar7 = Aig_ObjFanin0(pAVar6);
          Ssw_FramesWithClasses_rec(p,pAVar7,clk._4_4_);
          pAVar7 = Ssw_ObjChild0Fra(p,pAVar6,clk._4_4_);
          pAVar9 = Aig_ManConst0(p->pFrames);
          if (pAVar7 != pAVar9) {
            pAVar7 = Ssw_ObjChild0Fra(p,pAVar6,clk._4_4_);
            pAVar9 = Aig_ManConst1(p->pFrames);
            if (pAVar7 == pAVar9) {
              __assert_fail("Ssw_ObjChild0Fra(p,pObj,f) != Aig_ManConst1(p->pFrames)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                            ,0x2a0,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
            }
            pAVar7 = Ssw_ObjChild0Fra(p,pAVar6,clk._4_4_);
            pAVar9 = Aig_ManConst1(p->pFrames);
            if (pAVar7 == pAVar9) {
              Abc_Print(1,"Polarity violation.\n");
            }
            else {
              pAVar6 = Ssw_ObjChild0Fra(p,pAVar6,clk._4_4_);
              pAVar7 = Aig_ManConst0(p->pFrames);
              Ssw_NodesAreConstrained(p,pAVar6,pAVar7);
            }
          }
        }
      }
      clk._4_4_ = clk._4_4_ + 1;
    } while( true );
  }
  __assert_fail("Vec_IntSize(p->vInits) == iLits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                ,0x292,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
}

Assistant:

int Ssw_ManSweepConstr( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObj2, * pObjNew;
    int nConstrPairs, i, f, iLits;
    abctime clk;
//Ssw_ManPrintPolarity( p->pAig );

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    // add constants
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
    }
    // build logic cones for register inputs
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        pObj  = Aig_ManCo( p->pFrames, nConstrPairs + i );
        Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pObj) );//
    }

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
//    iLits = 0;
    iLits = f * Saig_ManPiNum(p->pAig);
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi(p->pFrames);
        pObjNew->fPhase = (p->vInits != NULL) && Vec_IntEntry(p->vInits, iLits++);
        Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    }
    assert( Vec_IntSize(p->vInits) == iLits );
p->timeReduce += Abc_Clock() - clk;

    // add constraints to all timeframes
    for ( f = 0; f <= p->pPars->nFramesK; f++ )
    {
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            Ssw_FramesWithClasses_rec( p, Aig_ObjFanin0(pObj), f );
//            if ( Aig_Regular(Ssw_ObjChild0Fra(p,pObj,f)) == Aig_ManConst1(p->pFrames) )
            if ( Ssw_ObjChild0Fra(p,pObj,f) == Aig_ManConst0(p->pFrames) )
                continue;
            assert( Ssw_ObjChild0Fra(p,pObj,f) != Aig_ManConst1(p->pFrames) );
            if ( Ssw_ObjChild0Fra(p,pObj,f) == Aig_ManConst1(p->pFrames) )
            {
                Abc_Print( 1, "Polarity violation.\n" );
                continue;
            }
            Ssw_NodesAreConstrained( p, Ssw_ObjChild0Fra(p,pObj,f), Aig_ManConst0(p->pFrames) );
        }
    }
    f = p->pPars->nFramesK;
    // clean the solver
    sat_solver_simplify( p->pMSat->pSat );


    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 0 );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 0 );
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );
    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}